

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLookupResultValid
               (TextureCubeArrayView *texture,Sampler *sampler,LookupPrecision *prec,
               IVec4 *coordBits,Vec4 *coord,Vec2 *lodBounds,Vec4 *result)

{
  float fVar1;
  CubeFace face_;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FilterMode FVar6;
  float fVar7;
  float a;
  float a_00;
  ConstPixelBufferAccess *local_630;
  ConstPixelBufferAccess *local_610;
  ConstPixelBufferAccess *local_5e0;
  ConstPixelBufferAccess *local_5c8;
  ConstPixelBufferAccess *local_5b0;
  undefined1 local_598 [8];
  ConstPixelBufferAccess faces_2 [6];
  ConstPixelBufferAccess faces_1 [6];
  int local_3ac;
  int levelNdx_1;
  int maxLevel_1;
  int minLevel_1;
  undefined1 local_398 [8];
  ConstPixelBufferAccess faces1 [6];
  ConstPixelBufferAccess faces0 [6];
  float maxF;
  float minF;
  int levelNdx;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  ConstPixelBufferAccess faces [6];
  bool canBeMinified;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  undefined1 local_8c [8];
  CubeFaceFloatCoords faceCoords;
  int tryFaceNdx;
  int layerNdx;
  CubeFace possibleFaces [6];
  int local_58;
  undefined1 local_54 [4];
  int numPossibleFaces;
  Vec3 layerCoord;
  IVec2 layerRange;
  Vec2 *lodBounds_local;
  Vec4 *coord_local;
  IVec4 *coordBits_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  TextureCubeArrayView *texture_local;
  
  iVar4 = TextureCubeArrayView::getNumLayers(texture);
  iVar5 = Vector<int,_4>::w(coordBits);
  fVar7 = Vector<float,_4>::w(coord);
  computeLayerRange((tcu *)(layerCoord.m_data + 1),iVar4,iVar5,fVar7);
  Vector<float,_4>::toWidth<3>((Vector<float,_4> *)local_54);
  local_58 = 0;
  TexVerifierUtil::getPossibleCubeFaces
            ((Vec3 *)local_54,&prec->coordBits,(CubeFace *)&tryFaceNdx,&local_58);
  if (local_58 == 0) {
    texture_local._7_1_ = true;
  }
  else {
    for (faceCoords.t = (float)Vector<int,_2>::x((Vector<int,_2> *)(layerCoord.m_data + 1));
        fVar7 = faceCoords.t, iVar4 = Vector<int,_2>::y((Vector<int,_2> *)(layerCoord.m_data + 1)),
        (int)fVar7 <= iVar4; faceCoords.t = (float)((int)faceCoords.t + 1)) {
      for (faceCoords.s = 0.0; (int)faceCoords.s < local_58;
          faceCoords.s = (float)((int)faceCoords.s + 1)) {
        face_ = (&tryFaceNdx)[(int)faceCoords.s];
        projectToFace((tcu *)&maxLod,(&tryFaceNdx)[(int)faceCoords.s],(Vec3 *)local_54);
        CubeFaceCoords<float>::CubeFaceCoords
                  ((CubeFaceCoords<float> *)local_8c,face_,(Vector<float,_2> *)&maxLod);
        a = Vector<float,_2>::x(lodBounds);
        a_00 = Vector<float,_2>::y(lodBounds);
        fVar7 = sampler->lodThreshold;
        fVar1 = sampler->lodThreshold;
        if (a <= sampler->lodThreshold) {
          local_5b0 = (ConstPixelBufferAccess *)&minTexLevel;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess(local_5b0);
            local_5b0 = local_5b0 + 1;
          } while (local_5b0 != (ConstPixelBufferAccess *)&faces[5].m_data);
          getCubeArrayLevelFaces
                    (texture,0,(int)faceCoords.t,(ConstPixelBufferAccess (*) [6])&minTexLevel);
          bVar2 = isCubeLevelSampleResultValid
                            ((ConstPixelBufferAccess (*) [6])&minTexLevel,sampler,sampler->magFilter
                             ,prec,(CubeFaceFloatCoords *)local_8c,result);
          if (bVar2) {
            return true;
          }
        }
        if (fVar1 <= a_00 && a_00 != fVar7) {
          bVar2 = TexVerifierUtil::isNearestMipmapFilter(sampler->minFilter);
          bVar3 = TexVerifierUtil::isLinearMipmapFilter(sampler->minFilter);
          iVar4 = TextureCubeArrayView::getNumLevels(texture);
          iVar5 = iVar4 + -1;
          if ((bVar3) && (0 < iVar5)) {
            fVar7 = ::deFloatFloor(a);
            maxF = (float)de::clamp<int>((int)fVar7,0,iVar4 + -2);
            fVar7 = ::deFloatFloor(a_00);
            iVar4 = de::clamp<int>((int)fVar7,0,iVar4 + -2);
            for (; (int)maxF <= iVar4; maxF = (float)((int)maxF + 1)) {
              faces0[5].m_data._4_4_ = de::clamp<float>(a - (float)(int)maxF,0.0,1.0);
              faces0[5].m_data._0_4_ = de::clamp<float>(a_00 - (float)(int)maxF,0.0,1.0);
              local_5c8 = (ConstPixelBufferAccess *)&faces1[5].m_data;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess(local_5c8);
                local_5c8 = local_5c8 + 1;
              } while (local_5c8 != (ConstPixelBufferAccess *)&faces0[5].m_data);
              local_5e0 = (ConstPixelBufferAccess *)local_398;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess(local_5e0);
                local_5e0 = local_5e0 + 1;
              } while (local_5e0 != (ConstPixelBufferAccess *)&faces1[5].m_data);
              getCubeArrayLevelFaces
                        (texture,(int)maxF,(int)faceCoords.t,
                         (ConstPixelBufferAccess (*) [6])&faces1[5].m_data);
              getCubeArrayLevelFaces
                        (texture,(int)maxF + 1,(int)faceCoords.t,
                         (ConstPixelBufferAccess (*) [6])local_398);
              FVar6 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
              Vector<float,_2>::Vector
                        ((Vector<float,_2> *)&maxLevel_1,faces0[5].m_data._4_4_,
                         faces0[5].m_data._0_4_);
              bVar2 = isCubeMipmapLinearSampleResultValid
                                ((ConstPixelBufferAccess (*) [6])&faces1[5].m_data,
                                 (ConstPixelBufferAccess (*) [6])local_398,sampler,FVar6,prec,
                                 (CubeFaceFloatCoords *)local_8c,(Vec2 *)&maxLevel_1,result);
              if (bVar2) {
                return true;
              }
            }
          }
          else if (bVar2) {
            fVar7 = ::deFloatCeil(a + 0.5);
            local_3ac = de::clamp<int>((int)fVar7 + -1,0,iVar5);
            fVar7 = ::deFloatFloor(a_00 + 0.5);
            iVar4 = de::clamp<int>((int)fVar7,0,iVar5);
            for (; local_3ac <= iVar4; local_3ac = local_3ac + 1) {
              local_610 = (ConstPixelBufferAccess *)&faces_2[5].m_data;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess(local_610);
                local_610 = local_610 + 1;
              } while (local_610 != (ConstPixelBufferAccess *)&faces_1[5].m_data);
              getCubeArrayLevelFaces
                        (texture,local_3ac,(int)faceCoords.t,
                         (ConstPixelBufferAccess (*) [6])&faces_2[5].m_data);
              FVar6 = TexVerifierUtil::getLevelFilter(sampler->minFilter);
              bVar2 = isCubeLevelSampleResultValid
                                ((ConstPixelBufferAccess (*) [6])&faces_2[5].m_data,sampler,FVar6,
                                 prec,(CubeFaceFloatCoords *)local_8c,result);
              if (bVar2) {
                return true;
              }
            }
          }
          else {
            local_630 = (ConstPixelBufferAccess *)local_598;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess(local_630);
              local_630 = local_630 + 1;
            } while (local_630 != (ConstPixelBufferAccess *)&faces_2[5].m_data);
            getCubeArrayLevelFaces
                      (texture,0,(int)faceCoords.t,(ConstPixelBufferAccess (*) [6])local_598);
            bVar2 = isCubeLevelSampleResultValid
                              ((ConstPixelBufferAccess (*) [6])local_598,sampler,sampler->minFilter,
                               prec,(CubeFaceFloatCoords *)local_8c,result);
            if (bVar2) {
              return true;
            }
          }
        }
      }
    }
    texture_local._7_1_ = false;
  }
  return texture_local._7_1_;
}

Assistant:

bool isLookupResultValid (const TextureCubeArrayView& texture, const Sampler& sampler, const LookupPrecision& prec, const IVec4& coordBits, const Vec4& coord, const Vec2& lodBounds, const Vec4& result)
{
	const IVec2	layerRange						= computeLayerRange(texture.getNumLayers(), coordBits.w(), coord.w());
	const Vec3	layerCoord						= coord.toWidth<3>();
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(layerCoord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int layerNdx = layerRange.x(); layerNdx <= layerRange.y(); layerNdx++)
	{
		for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
		{
			const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], layerCoord));
			const float					minLod			= lodBounds.x();
			const float					maxLod			= lodBounds.y();
			const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
			const bool					canBeMinified	= maxLod > sampler.lodThreshold;

			if (canBeMagnified)
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
					return true;
			}

			if (canBeMinified)
			{
				const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
				const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
				const int	minTexLevel		= 0;
				const int	maxTexLevel		= texture.getNumLevels()-1;

				DE_ASSERT(minTexLevel <= maxTexLevel);

				if (isLinearMipmap && minTexLevel < maxTexLevel)
				{
					const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						const float		minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
						const float		maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

						ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
						ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

						getCubeArrayLevelFaces(texture, levelNdx,		layerNdx,	faces0);
						getCubeArrayLevelFaces(texture, levelNdx + 1,	layerNdx,	faces1);

						if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
							return true;
					}
				}
				else if (isNearestMipmap)
				{
					// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
					//		 decision to allow floor(lod + 0.5) as well.
					const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
					const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

					DE_ASSERT(minLevel <= maxLevel);

					for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
					{
						ConstPixelBufferAccess faces[CUBEFACE_LAST];
						getCubeArrayLevelFaces(texture, levelNdx, layerNdx, faces);

						if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
							return true;
					}
				}
				else
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeArrayLevelFaces(texture, 0, layerNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
						return true;
				}
			}
		}
	}

	return false;
}